

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O1

void makeMappings(vector<int,_std::allocator<int>_> *mapping,string *mapstring)

{
  pointer pcVar1;
  pointer piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  string newmap;
  undefined1 *local_40;
  ulong local_38;
  undefined1 local_30 [16];
  
  pcVar1 = (mapstring->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + mapstring->_M_string_length);
  uVar12 = 0;
  std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_38,0,'\x01');
  uVar6 = (uint)local_38;
  if (0 < (int)uVar6) {
    uVar12 = 0;
    do {
      if ((int)(char)local_40[uVar12] - 0x30U < 10) goto LAB_0011dbc8;
      uVar12 = uVar12 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar12);
    uVar12 = local_38 & 0xffffffff;
  }
LAB_0011dbc8:
  if ((int)uVar12 < (int)uVar6) {
    piVar2 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar7 = local_40 + (uVar12 & 0xffffffff);
    bVar3 = true;
    iVar8 = 0;
    uVar9 = 0;
    bVar5 = false;
    do {
      uVar11 = (int)*pcVar7 - 0x30;
      if (uVar11 < 10) {
        if (bVar3) {
          uVar9 = uVar11 + uVar9 * 10;
        }
        else {
          iVar8 = uVar11 + iVar8 * 10;
        }
        bVar5 = false;
      }
      else {
        bVar4 = !bVar3;
        if (bVar5) {
          bVar4 = bVar3;
        }
        if (bVar4) {
          if (0x7e < (int)uVar9) {
            uVar9 = 0x7f;
          }
          uVar10 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar10 = 0;
          }
          if (0x7e < iVar8) {
            iVar8 = 0x7f;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          piVar2[uVar10] = iVar8;
          bVar5 = true;
          bVar3 = true;
          uVar9 = 0;
          iVar8 = 0;
        }
        else {
          bVar3 = false;
          bVar5 = true;
        }
      }
      pcVar7 = pcVar7 + 1;
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while ((int)uVar11 < (int)uVar6);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void makeMappings(vector<int>& mapping, const string& mapstring) {
   string newmap = mapstring + ' ';
   int ltx = 0;
   int d = 1;
   int digit1 = 0;
   int digit2 = 0;
   int ii;
   for (ii=0; ii<(int)newmap.size(); ii++) {
      if (isdigit(newmap[ii])) {
         break;
      }
   }
   for (int i=ii; i<(int)newmap.size(); i++) {
      if (isdigit(newmap[i])) {
        if (d) {
          digit1 = digit1 * 10 + (newmap[i] - '0');
        } else {
          digit2 = digit2 * 10 + (newmap[i] - '0');
        }
        ltx = 0;
      } else {
         if (!ltx) {
            d = !d;
         }
         ltx = 1;
         if (d) {
            digit1 = digit1 > 127 ? 127 : digit1;
            digit1 = digit1 <   0 ?   0 : digit1;
            digit2 = digit2 > 127 ? 127 : digit2;
            digit2 = digit2 <   0 ?   0 : digit2;
            mapping[digit1] = digit2;
            digit1 = 0;
            digit2 = 0;
         }
      }
   }
}